

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.hpp
# Opt level: O2

void __thiscall
cpp_client::Any::
holder2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~holder2
          (holder2<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ~holder2(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~holder2() noexcept override = default;